

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

_Bool ECDSA_Verify(COSE *pSigner,int index,eckey_t *eckey,int cbitDigest,byte *rgbToSign,
                  size_t cbToSign,cose_errback *perr)

{
  byte bVar1;
  int iVar2;
  cn_cbor *pcVar3;
  _Bool local_91;
  _Bool result;
  cn_cbor *pSig;
  byte rgbDigest [32];
  mbedtls_md_info_t *pmdInfo;
  undefined1 local_58 [4];
  mbedtls_md_type_t mdType;
  mbedtls_mpi s;
  mbedtls_mpi r;
  size_t cbToSign_local;
  byte *rgbToSign_local;
  int cbitDigest_local;
  eckey_t *eckey_local;
  int index_local;
  COSE *pSigner_local;
  
  local_91 = false;
  mbedtls_mpi_init((mbedtls_mpi *)&s.s);
  mbedtls_mpi_init((mbedtls_mpi *)local_58);
  if (cbitDigest == 0x100) {
    pmdInfo._4_4_ = MBEDTLS_MD_SHA256;
  }
  else if (cbitDigest == 0x180) {
    pmdInfo._4_4_ = MBEDTLS_MD_SHA384;
  }
  else {
    if (cbitDigest != 0x200) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
      goto LAB_0034de4c;
    }
    pmdInfo._4_4_ = MBEDTLS_MD_SHA512;
  }
  rgbDigest._24_8_ = mbedtls_md_info_from_type(pmdInfo._4_4_);
  if ((mbedtls_md_info_t *)rgbDigest._24_8_ == (mbedtls_md_info_t *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else {
    iVar2 = mbedtls_md((mbedtls_md_info_t *)rgbDigest._24_8_,rgbToSign,cbToSign,(uchar *)&pSig);
    if (iVar2 == 0) {
      pcVar3 = _COSE_arrayget_int(pSigner,index);
      if ((pcVar3 == (cn_cbor *)0x0) || (pcVar3->type != CN_CBOR_BYTES)) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
      }
      else {
        iVar2 = mbedtls_mpi_read_binary
                          ((mbedtls_mpi *)&s.s,(pcVar3->v).bytes,(long)(pcVar3->length / 2));
        if (iVar2 == 0) {
          iVar2 = mbedtls_mpi_read_binary
                            ((mbedtls_mpi *)local_58,(pcVar3->v).bytes + pcVar3->length / 2,
                             (long)(pcVar3->length / 2));
          if (iVar2 == 0) {
            bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)rgbDigest._24_8_);
            iVar2 = mbedtls_ecdsa_verify
                              (&eckey->grp,(uchar *)&pSig,(ulong)bVar1,&eckey->Q,(mbedtls_mpi *)&s.s
                               ,(mbedtls_mpi *)local_58);
            if (iVar2 == 0) {
              local_91 = true;
            }
            else if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_CRYPTO_FAIL;
            }
          }
          else if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_OUT_OF_MEMORY;
          }
        }
        else if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
LAB_0034de4c:
  mbedtls_mpi_free((mbedtls_mpi *)&s.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_58);
  return local_91;
}

Assistant:

bool ECDSA_Verify(COSE * pSigner, int index, const eckey_t * eckey, int cbitDigest, const byte * rgbToSign, size_t cbToSign, cose_errback * perr)
{
	mbedtls_mpi r;
	mbedtls_mpi s;
	mbedtls_md_type_t mdType;
	const mbedtls_md_info_t *pmdInfo;
	byte rgbDigest[MBEDTLS_MD_MAX_SIZE];
	cn_cbor * pSig;
	bool result = false;

	mbedtls_mpi_init(&r);
	mbedtls_mpi_init(&s);

	switch(cbitDigest)
	{
	case 256:
		mdType = MBEDTLS_MD_SHA256;
		break;

	case 384:
		mdType = MBEDTLS_MD_SHA384;
		break;

	case 512:
		mdType = MBEDTLS_MD_SHA512;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	pmdInfo = mbedtls_md_info_from_type(mdType);
	CHECK_CONDITION(pmdInfo != NULL, COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(mbedtls_md(pmdInfo, rgbToSign, cbToSign, rgbDigest) == 0, COSE_ERR_INVALID_PARAMETER);

	pSig = _COSE_arrayget_int(pSigner, index);
	CHECK_CONDITION((pSig != NULL) && (pSig->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_mpi_read_binary( &r, pSig->v.bytes, pSig->length / 2 ) == 0, COSE_ERR_OUT_OF_MEMORY);
	CHECK_CONDITION(mbedtls_mpi_read_binary( &s, pSig->v.bytes + pSig->length / 2, pSig->length / 2 ) == 0, COSE_ERR_OUT_OF_MEMORY);
	CHECK_CONDITION(mbedtls_ecdsa_verify((mbedtls_ecp_group*)&eckey->grp, rgbDigest, mbedtls_md_get_size(pmdInfo), &eckey->Q, &r, &s) == 0, COSE_ERR_CRYPTO_FAIL);

	result = true;

errorReturn:
	mbedtls_mpi_free(&r);
	mbedtls_mpi_free(&s);
	return result;
}